

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

void embree::destroyThread(thread_t tid)

{
  pthread_cancel(*(pthread_t *)tid);
  operator_delete(tid);
  return;
}

Assistant:

void destroyThread(thread_t tid) {
#if defined(__ANDROID__)
    FATAL("Can't destroy threads on Android."); // pthread_cancel not implemented.
#else
    pthread_cancel(*(pthread_t*)tid);
    delete (pthread_t*)tid;
#endif
  }